

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_kmgmt.c
# Opt level: O0

char * ec_query_operation_name(int operation_id)

{
  int operation_id_local;
  char *local_8;
  
  if (operation_id == 0xb) {
    local_8 = "ECDH";
  }
  else if (operation_id == 0xc) {
    local_8 = "ECDSA";
  }
  else {
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

static
const char *ec_query_operation_name(int operation_id)
{
    switch (operation_id) {
    case OSSL_OP_KEYEXCH:
        return "ECDH";
    case OSSL_OP_SIGNATURE:
        return "ECDSA";
    }
    return NULL;
}